

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::mat4::homogeneous::rotation(mat4 *__return_storage_ptr__,vec3 *axis,float_t rad)

{
  mat3 local_38;
  float_t local_14;
  vec3 *pvStack_10;
  float_t rad_local;
  vec3 *axis_local;
  
  local_14 = rad;
  pvStack_10 = axis;
  mat3::rotation(&local_38,axis,rad);
  from_mat3(__return_storage_ptr__,&local_38);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::rotation(const vec3& axis, float_t rad)
{
    return mat4::homogeneous::from_mat3(mat3::rotation(axis, rad));
}